

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libclient.cpp
# Opt level: O1

string * __thiscall client::invoke(string *__return_storage_ptr__,client *this,string *request)

{
  pointer pcVar1;
  message reply_message;
  message request_message;
  long *local_90;
  long local_88;
  long local_80 [2];
  message local_70;
  long *local_48 [2];
  long local_38 [2];
  long *local_28;
  long local_20;
  
  pcVar1 = (request->_M_dataplus)._M_p;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_48,pcVar1,pcVar1 + request->_M_string_length);
  message::message(&local_70,(string *)local_48);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  local_90 = local_80;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_90,local_70.body_._M_dataplus._M_p,
             local_70.body_._M_dataplus._M_p + local_70.body_._M_string_length);
  local_20 = local_88 + (long)local_90;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  local_28 = local_90;
  std::__cxx11::string::
  _M_construct<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
            ((string *)__return_storage_ptr__);
  if (local_90 != local_80) {
    operator_delete(local_90,local_80[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.body_._M_dataplus._M_p != &local_70.body_.field_2) {
    operator_delete(local_70.body_._M_dataplus._M_p,local_70.body_.field_2._M_allocated_capacity + 1
                   );
  }
  return __return_storage_ptr__;
}

Assistant:

std::string client::invoke(const std::string& request) {
    message request_message(request);
    // Invoke server here.
    const auto reply_message = request_message;
    return {reply_message.body().crbegin(), reply_message.body().crend()};
}